

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_result_t exr_write_header(exr_context_t ctxt)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  exr_priv_part_t p_Var2;
  uint64_t uVar3;
  int32_t val;
  exr_result_t eVar4;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  ulong uVar5;
  char *pcVar6;
  exr_context_t nonc;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE_00;
  ulong uVar7;
  exr_result_t eStack_40;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar4 = 2;
  }
  else {
    __mutex = &ctxt->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (ctxt->mode != '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar4 = (*ctxt->standard_error)(ctxt,8);
      return eVar4;
    }
    iVar1 = ctxt->num_parts;
    if ((long)iVar1 == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE = ctxt->report_error;
      pcVar6 = "No parts defined in file prior to writing data";
LAB_00113dfa:
      eVar4 = (*UNRECOVERED_JUMPTABLE)(ctxt,6,pcVar6);
      return eVar4;
    }
    for (uVar7 = (ulong)(iVar1 < 2); (long)uVar7 < (long)iVar1; uVar7 = uVar7 + 1) {
      if (ctxt->parts[uVar7]->name == (exr_attribute_t *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        UNRECOVERED_JUMPTABLE_00 = ctxt->print_error;
        pcVar6 = "Part %d missing required name for multi-part file";
        eStack_40 = 3;
        goto LAB_00113ede;
      }
    }
    uVar7 = 0;
    eVar4 = 0;
    while (eVar4 == 0) {
      if ((long)ctxt->num_parts <= (long)uVar7) {
        ctxt->output_file_offset = 0;
        eVar4 = internal_exr_write_header(ctxt);
        if (eVar4 == 0) {
          ctxt->mode = '\x03';
          ctxt->cur_output_part = 0;
          ctxt->last_output_chunk = -1;
          ctxt->output_chunk_count = 0;
          eVar4 = 0;
          uVar7 = (ulong)(uint)ctxt->num_parts;
          if (ctxt->num_parts < 1) {
            uVar7 = 0;
          }
          for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
            uVar3 = ctxt->output_file_offset;
            p_Var2 = ctxt->parts[uVar5];
            p_Var2->chunk_table_offset = uVar3;
            ctxt->output_file_offset = uVar3 + (long)p_Var2->chunk_count * 8;
          }
        }
        goto LAB_00113f99;
      }
      p_Var2 = ctxt->parts[uVar7];
      if (p_Var2->channels == (exr_attribute_t *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        UNRECOVERED_JUMPTABLE_00 = ctxt->print_error;
        pcVar6 = "Part %d is missing channel list";
        eStack_40 = 0xd;
LAB_00113ede:
        eVar4 = (*UNRECOVERED_JUMPTABLE_00)
                          (ctxt,eStack_40,pcVar6,uVar7 & 0xffffffff,UNRECOVERED_JUMPTABLE_00);
        return eVar4;
      }
      eVar4 = internal_exr_compute_tile_information(ctxt,p_Var2,0);
      if (eVar4 != 0) break;
      val = internal_exr_compute_chunk_offset_size(p_Var2);
      if (val < 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        UNRECOVERED_JUMPTABLE = ctxt->report_error;
        pcVar6 = "Invalid part specification computing number of chunks in file";
        goto LAB_00113dfa;
      }
      p_Var2->chunk_count = val;
      if ((ctxt->has_nonimage_data != '\0') || (ctxt->is_multipart != '\0')) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar4 = exr_attr_set_int(ctxt,(int)uVar7,"chunkCount",val);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (eVar4 != 0) break;
      }
      eVar4 = internal_exr_validate_write_part(ctxt,p_Var2);
      uVar7 = uVar7 + 1;
    }
    ctxt->output_file_offset = 0;
LAB_00113f99:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return eVar4;
}

Assistant:

exr_result_t
exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    internal_exr_lock (ctxt);

    if (ctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (ctxt->num_parts == 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "No parts defined in file prior to writing data"));

    /* add part and set name should have already validated the uniqueness
     * so just ensure the name has been set for multi part files
     */
    for ( int p = ctxt->num_parts > 1 ? 0 : 1; p < ctxt->num_parts; ++p )
    {
        const exr_attribute_t* pname = ctxt->parts[p]->name;
        if (!pname)
        {
            return EXR_UNLOCK_AND_RETURN (
                ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Part %d missing required name for multi-part file",
                    p));
        }
    }

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        exr_priv_part_t curp = ctxt->parts[p];

        int32_t ccount = 0;

        if (!curp->channels)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Part %d is missing channel list",
                p));

        rv = internal_exr_compute_tile_information (ctxt, curp, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curp);
        if (ccount < 0)
            return EXR_UNLOCK_AND_RETURN (
                ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid part specification computing number of chunks in file"));

        curp->chunk_count = ccount;

        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            internal_exr_unlock (ctxt);
            rv = exr_attr_set_int (ctxt, p, EXR_REQ_CHUNK_COUNT_STR, ccount);
            internal_exr_lock (ctxt);
            if (rv != EXR_ERR_SUCCESS) break;
        }

        rv = internal_exr_validate_write_part (ctxt, curp);
    }

    ctxt->output_file_offset = 0;

    if (rv == EXR_ERR_SUCCESS) rv = internal_exr_write_header (ctxt);

    if (rv == EXR_ERR_SUCCESS)
    {
        ctxt->mode               = EXR_CONTEXT_WRITING_DATA;
        ctxt->cur_output_part    = 0;
        ctxt->last_output_chunk  = -1;
        ctxt->output_chunk_count = 0;
        for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
        {
            exr_priv_part_t curp = ctxt->parts[p];

            curp->chunk_table_offset = ctxt->output_file_offset;
            ctxt->output_file_offset +=
                (uint64_t) (curp->chunk_count) * sizeof (uint64_t);
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}